

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::calendar_impl::adjust_value
          (calendar_impl *this,period_mark p,update_type u,int difference)

{
  UCalendarDateFields UVar1;
  Calendar *pCVar2;
  undefined4 in_ECX;
  int in_EDX;
  long in_RDI;
  period_mark in_stack_00000010;
  undefined4 in_stack_00000014;
  UErrorCode err;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = 0;
  local_14 = in_ECX;
  if (in_EDX == 0) {
    pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50));
    UVar1 = to_icu(in_stack_00000010);
    (**(code **)(*(long *)pCVar2 + 0x38))(pCVar2,UVar1,local_14,&local_18);
  }
  else if (in_EDX == 1) {
    pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50));
    UVar1 = to_icu(in_stack_00000010);
    (**(code **)(*(long *)pCVar2 + 0x48))(pCVar2,UVar1,local_14,&local_18);
  }
  check_and_throw_dt((UErrorCode *)CONCAT44(in_stack_00000014,in_stack_00000010));
  return;
}

Assistant:

virtual void adjust_value(period::marks::period_mark p,update_type u,int difference)
        {
            UErrorCode err=U_ZERO_ERROR;
            switch(u) {
            case move:
                calendar_->add(to_icu(p),difference,err);
                break;
            case roll:
                calendar_->roll(to_icu(p),difference,err);
                break;
            }
            check_and_throw_dt(err);
        }